

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  Extension *pEVar1;
  long *plVar2;
  Nonnull<const_char_*> pcVar3;
  ExtensionSet *this_00;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar4;
  
  pVar4 = Insert(this,number);
  pEVar1 = pVar4.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated != false) goto LAB_002882d0;
    pcVar3 = (Nonnull<const_char_*>)0x0;
LAB_00288283:
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      if (0xed < (byte)(pEVar1->type - 0x13)) {
        if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 9)
        {
          pcVar3 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                              (ulong)pEVar1->type * 4),9,
                              "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_STRING");
        }
        if (pcVar3 != (Nonnull<const_char_*>)0x0) goto LAB_00288341;
        goto LAB_002882b3;
      }
      this_00 = (ExtensionSet *)&stack0xffffffffffffffd0;
      MutableString_abi_cxx11_(this_00);
LAB_002882ef:
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)this_00,9,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_STRING");
      goto LAB_00288241;
    }
    MutableString_abi_cxx11_();
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      MutableString_abi_cxx11_((ExtensionSet *)&stack0xffffffffffffffd0);
LAB_002882d0:
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,1,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
      goto LAB_00288283;
    }
    this_00 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (this_00 != (ExtensionSet *)0x9) goto LAB_002882ef;
    pcVar3 = (Nonnull<const_char_*>)0x0;
LAB_00288241:
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      pEVar1->is_repeated = false;
      pEVar1->field_0xa = pEVar1->field_0xa | 1;
      if (&this->arena_->impl_ == (ThreadSafeArena *)0x0) {
        plVar2 = (long *)operator_new(0x20);
      }
      else {
        plVar2 = (long *)ThreadSafeArena::AllocateFromStringBlock(&this->arena_->impl_);
      }
      *plVar2 = (long)(plVar2 + 2);
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      *(long **)&(pEVar1->field_0).int32_t_value = plVar2;
LAB_002882b3:
      pEVar1->field_0xa = pEVar1->field_0xa & 0xfd;
      return (string *)(pEVar1->field_0).int64_t_value;
    }
  }
  MutableString_abi_cxx11_();
LAB_00288341:
  MutableString_abi_cxx11_();
}

Assistant:

std::string* ExtensionSet::MutableString(int number, FieldType type,
                                         const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->ptr.string_value = Arena::Create<std::string>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
  }
  extension->is_cleared = false;
  return extension->ptr.string_value;
}